

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_barrier_test.cc
# Opt level: O0

void disruptor::test::SequenceBarrier::WaitForCursor_invoker(void)

{
  basic_wrap_stringstream<char> *this;
  basic_wrap_stringstream<char> *s;
  basic_wrap_stringstream<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  WaitForCursor t;
  char (*in_stack_fffffffffffff418) [19];
  basic_wrap_stringstream<char> *in_stack_fffffffffffff420;
  std_string *in_stack_fffffffffffff428;
  basic_cstring<const_char> *in_stack_fffffffffffff430;
  basic_wrap_stringstream<char> *in_stack_fffffffffffff440;
  basic_wrap_stringstream<char> *pbVar2;
  undefined1 local_af0 [296];
  WaitForCursor *in_stack_fffffffffffff638;
  undefined1 local_958 [16];
  basic_cstring<const_char> local_948;
  undefined1 local_931;
  basic_wrap_stringstream<char> local_930;
  undefined1 local_798 [16];
  basic_cstring<const_char> local_788;
  undefined1 local_771;
  basic_wrap_stringstream<char> local_770;
  undefined1 local_5d8 [16];
  basic_cstring<const_char> local_5c8;
  undefined1 local_5b1;
  basic_wrap_stringstream<char> local_5b0;
  undefined1 local_418 [16];
  basic_cstring<const_char> local_408 [36];
  undefined1 local_1b9;
  basic_wrap_stringstream<char> local_1b8;
  undefined1 local_20 [16];
  basic_cstring<const_char> local_10;
  
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
             ,0x6e);
  memset(&local_1b8,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff420);
  boost::basic_wrap_stringstream<char>::ref(&local_1b8);
  local_1b9 = 0x22;
  boost::operator<<(in_stack_fffffffffffff420,*in_stack_fffffffffffff418);
  boost::operator<<(in_stack_fffffffffffff420,(char (*) [14])in_stack_fffffffffffff418);
  boost::operator<<(in_stack_fffffffffffff420,(char (*) [15])in_stack_fffffffffffff418);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff440);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,&local_10,0x3f,local_20);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff420);
  WaitForCursor::WaitForCursor((WaitForCursor *)0x10b25f);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (local_408,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
             ,0x6e);
  memset(&local_5b0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff420);
  boost::basic_wrap_stringstream<char>::ref(&local_5b0);
  local_5b1 = 0x22;
  boost::operator<<(in_stack_fffffffffffff420,*in_stack_fffffffffffff418);
  boost::operator<<(in_stack_fffffffffffff420,(char (*) [14])in_stack_fffffffffffff418);
  boost::operator<<(in_stack_fffffffffffff420,(char (*) [16])in_stack_fffffffffffff418);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff440);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,local_408,0x3f,local_418);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff420);
  boost::unit_test::setup_conditional<disruptor::test::SequenceBarrier::WaitForCursor>
            ((WaitForCursor *)in_stack_fffffffffffff420);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_5c8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
             ,0x6e);
  memset(&local_770,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff420);
  boost::basic_wrap_stringstream<char>::ref(&local_770);
  local_771 = 0x22;
  boost::operator<<(in_stack_fffffffffffff420,*in_stack_fffffffffffff418);
  boost::operator<<(in_stack_fffffffffffff420,(char (*) [14])in_stack_fffffffffffff418);
  boost::operator<<(in_stack_fffffffffffff420,(char (*) [13])in_stack_fffffffffffff418);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff440);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,&local_5c8,0x3f,local_5d8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff420);
  WaitForCursor::test_method(in_stack_fffffffffffff638);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_788,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
             ,0x6e);
  memset(&local_930,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff420);
  boost::basic_wrap_stringstream<char>::ref(&local_930);
  local_931 = 0x22;
  boost::operator<<(in_stack_fffffffffffff420,*in_stack_fffffffffffff418);
  boost::operator<<(in_stack_fffffffffffff420,(char (*) [14])in_stack_fffffffffffff418);
  boost::operator<<(in_stack_fffffffffffff420,in_stack_fffffffffffff418);
  boost::basic_wrap_stringstream<char>::str_abi_cxx11_(in_stack_fffffffffffff440);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            (in_stack_fffffffffffff430,in_stack_fffffffffffff428);
  boost::unit_test::unit_test_log_t::set_checkpoint(pbVar2,&local_788,0x3f,local_798);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(in_stack_fffffffffffff420);
  boost::unit_test::teardown_conditional<disruptor::test::SequenceBarrier::WaitForCursor>
            ((WaitForCursor *)in_stack_fffffffffffff420);
  pbVar2 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_948,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/sequence_barrier_test.cc"
             ,0x6e);
  memset(local_af0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(in_stack_fffffffffffff420);
  boost::basic_wrap_stringstream<char>::ref((basic_wrap_stringstream<char> *)local_af0);
  this = boost::operator<<(in_stack_fffffffffffff420,*in_stack_fffffffffffff418);
  s = boost::operator<<(in_stack_fffffffffffff420,(char (*) [14])in_stack_fffffffffffff418);
  this_00 = boost::operator<<(in_stack_fffffffffffff420,(char (*) [15])in_stack_fffffffffffff418);
  pbVar1 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring
            ((basic_cstring<const_char> *)this,(std_string *)s);
  boost::unit_test::unit_test_log_t::set_checkpoint
            (pbVar2,&local_948,0x3f,local_958,in_R8,in_R9,pbVar1);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(this_00);
  WaitForCursor::~WaitForCursor((WaitForCursor *)0x10b6b3);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(WaitForCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(barrier.WaitFor(kFirstSequenceValue));
  });

  BOOST_CHECK_EQUAL(return_value.load(), kInitialCursorValue);
  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();
  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);

  std::thread waiter2([this, &return_value]() {
    return_value.store(
        barrier.WaitFor(kFirstSequenceValue + 1L, std::chrono::seconds(5)));
  });

  std::thread([this]() { cursor.IncrementAndGet(1L); }).join();

  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue + 1L);
}